

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

void uset_setSerializedToOne_63(USerializedSet *fillSet,UChar32 c)

{
  uint16_t uVar1;
  UChar32 c_local;
  USerializedSet *fillSet_local;
  
  if ((fillSet != (USerializedSet *)0x0) && ((uint)c < 0x110000)) {
    fillSet->array = fillSet->staticArray;
    uVar1 = (uint16_t)c;
    if (c < 0xffff) {
      fillSet->length = 2;
      fillSet->bmpLength = 2;
      fillSet->staticArray[0] = uVar1;
      fillSet->staticArray[1] = uVar1 + 1;
    }
    else if (c == 0xffff) {
      fillSet->bmpLength = 1;
      fillSet->length = 3;
      fillSet->staticArray[0] = 0xffff;
      fillSet->staticArray[1] = 1;
      fillSet->staticArray[2] = 0;
    }
    else if (c < 0x10ffff) {
      fillSet->bmpLength = 0;
      fillSet->length = 4;
      fillSet->staticArray[0] = (uint16_t)((uint)c >> 0x10);
      fillSet->staticArray[1] = uVar1;
      fillSet->staticArray[2] = (uint16_t)((uint)(c + 1) >> 0x10);
      fillSet->staticArray[3] = (uint16_t)(c + 1);
    }
    else {
      fillSet->bmpLength = 0;
      fillSet->length = 2;
      fillSet->staticArray[0] = 0x10;
      fillSet->staticArray[1] = 0xffff;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uset_setSerializedToOne(USerializedSet* fillSet, UChar32 c) {
    if(fillSet==NULL || (uint32_t)c>0x10ffff) {
        return;
    }

    fillSet->array=fillSet->staticArray;
    if(c<0xffff) {
        fillSet->bmpLength=fillSet->length=2;
        fillSet->staticArray[0]=(uint16_t)c;
        fillSet->staticArray[1]=(uint16_t)c+1;
    } else if(c==0xffff) {
        fillSet->bmpLength=1;
        fillSet->length=3;
        fillSet->staticArray[0]=0xffff;
        fillSet->staticArray[1]=1;
        fillSet->staticArray[2]=0;
    } else if(c<0x10ffff) {
        fillSet->bmpLength=0;
        fillSet->length=4;
        fillSet->staticArray[0]=(uint16_t)(c>>16);
        fillSet->staticArray[1]=(uint16_t)c;
        ++c;
        fillSet->staticArray[2]=(uint16_t)(c>>16);
        fillSet->staticArray[3]=(uint16_t)c;
    } else /* c==0x10ffff */ {
        fillSet->bmpLength=0;
        fillSet->length=2;
        fillSet->staticArray[0]=0x10;
        fillSet->staticArray[1]=0xffff;
    }
}